

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_request_state(connectdata *conn,_Bool *done)

{
  curl_off_t *pcVar1;
  _Bool _Var2;
  undefined2 uVar3;
  int *piVar4;
  char *pcVar5;
  char *__s;
  curl_off_t cVar6;
  void *pvVar7;
  smb_header *h;
  undefined4 uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  size_t sVar13;
  size_t sVar14;
  Curl_easy *pCVar15;
  long lVar16;
  long lVar17;
  ulong len;
  size_t upload_size;
  void *msg;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined2 uStack_45b;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  char acStack_451 [2];
  undefined4 uStack_44f;
  undefined2 uStack_44b;
  char local_444 [4];
  int local_440;
  short local_433;
  char local_431 [1025];
  
  piVar4 = (int *)(conn->data->req).protop;
  msg = (void *)0x0;
  if (*piVar4 == 0) {
    pcVar5 = (conn->host).name;
    sVar13 = strlen(pcVar5);
    __s = (conn->proto).ftpc.pp.linestart_resp;
    sVar14 = strlen(__s);
    if ((sVar14 + sVar13) - 0x3f7 < 0xfffffffffffffbff) {
      CVar11 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_00139a28;
    }
    memset(&local_462,0,0x409);
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_459 = 0x5c5c;
    acStack_457[0] = '\0';
    strcpy(acStack_457,pcVar5);
    sVar13 = strlen(pcVar5);
    (acStack_457 + sVar13)[0] = '\\';
    (acStack_457 + sVar13)[1] = '\0';
    strcpy(acStack_457 + sVar13 + 1,__s);
    sVar14 = strlen(__s);
    builtin_strncpy(acStack_457 + sVar14 + sVar13 + 2,"????",4);
    (acStack_451 + sVar14 + sVar13)[0] = '?';
    (acStack_451 + sVar14 + sVar13)[1] = '\0';
    uStack_45b = (short)(acStack_457 + ((sVar14 + sVar13) - (long)&uStack_459) + 1) + 7;
    CVar11 = smb_send_message(conn,'u',&local_464,
                              (size_t)(acStack_457 + ((sVar14 + sVar13) - (long)&uStack_459) + 1 +
                                      0x12));
    if (CVar11 != CURLE_OK) goto LAB_00139a28;
    *(undefined4 *)(conn->data->req).protop = 1;
  }
  CVar11 = smb_send_and_recv(conn,&msg);
  pvVar7 = msg;
  if ((CVar11 != CURLE_OK) && (CVar11 != CURLE_AGAIN)) {
LAB_00139a28:
    Curl_conncontrol(conn,1);
    return CVar11;
  }
  CVar11 = CURLE_OK;
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  switch(*piVar4) {
  case 1:
    if (*(int *)((long)msg + 9) != 0) {
      CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)msg + 9) == 0x50001) {
        CVar12 = CURLE_REMOTE_ACCESS_DENIED;
      }
      piVar4[5] = CVar12;
      goto LAB_00139b7d;
    }
    *(undefined2 *)(piVar4 + 4) = *(undefined2 *)((long)msg + 0x1c);
    (conn->proto).ftpc.pp.response_time = 0;
    pCVar15 = conn->data;
    pcVar5 = *(char **)((long)(pCVar15->req).protop + 8);
    sVar13 = strlen(pcVar5);
    if (sVar13 - 0x400 < 0xfffffffffffffbff) {
      CVar12 = CURLE_FILESIZE_EXCEEDED;
    }
    else {
      memset(&local_462,0,0x431);
      local_464 = 0x18;
      uStack_463 = 0xff;
      uStack_45e = (undefined1)sVar13;
      uStack_45d = (undefined1)(sVar13 >> 8);
      local_444[0] = '\a';
      local_444[1] = '\0';
      local_444[2] = '\0';
      local_444[3] = '\0';
      _Var2 = (pCVar15->set).upload;
      acStack_451[0] = (_Var2 - 2U) * '@';
      local_440 = (uint)_Var2 * 4 + 1;
      uStack_454 = 0;
      uStack_452 = 0;
      local_433 = (short)sVar13 + 1;
      strcpy(local_431,pcVar5);
      CVar12 = smb_send_message(conn,0xa2,&local_464,sVar13 + 0x34);
    }
    uVar8 = 2;
    break;
  case 2:
    if ((*(int *)((long)msg + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 100)) {
      piVar4[5] = 0x4e;
      goto switchD_00139920_caseD_5;
    }
    *(undefined2 *)((long)piVar4 + 0x12) = *(undefined2 *)((long)msg + 0x2a);
    pCVar15 = conn->data;
    (pCVar15->req).offset = 0;
    if ((pCVar15->set).upload != true) {
      lVar16 = *(long *)((long)msg + 0x5c);
      (pCVar15->req).size = lVar16;
      if (lVar16 < 0) {
        CVar12 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_00139e52;
      }
      Curl_pgrsSetDownloadSize(pCVar15,lVar16);
      pCVar15 = conn->data;
      if ((pCVar15->set).get_filetime == true) {
        (pCVar15->info).filetime = (*(long *)((long)pvVar7 + 0x48) + -0x19db1ded53e8000) / 10000000;
      }
LAB_00139df5:
      (conn->proto).ftpc.pp.response_time = 0;
      cVar6 = (pCVar15->req).offset;
      uStack_452 = 0;
      acStack_451[0] = '\0';
      acStack_451[1] = 0;
      uStack_44b = 0;
      local_462 = 0;
      uStack_461 = 0;
      acStack_457[2] = 0;
      uStack_454 = 0;
      local_464 = 0xc;
      uStack_463 = 0xff;
      uVar3 = *(undefined2 *)((long)(pCVar15->req).protop + 0x12);
      uStack_45f = (undefined1)uVar3;
      uStack_45e = (undefined1)((ushort)uVar3 >> 8);
      uStack_45d = (undefined1)cVar6;
      uStack_45c = (undefined1)((ulong)cVar6 >> 8);
      uStack_45b._0_1_ = (undefined1)((ulong)cVar6 >> 0x10);
      uStack_45b._1_1_ = (undefined1)((ulong)cVar6 >> 0x18);
      uStack_44f = (undefined4)((ulong)cVar6 >> 0x20);
      uStack_459 = 0x8000;
      acStack_457[0] = '\0';
      acStack_457[1] = 0x80;
      CVar12 = smb_send_message(conn,'.',&local_464,0x1b);
      uVar8 = 3;
      break;
    }
    cVar6 = (pCVar15->state).infilesize;
    (pCVar15->req).size = cVar6;
    Curl_pgrsSetUploadSize(pCVar15,cVar6);
    pCVar15 = conn->data;
    lVar16 = (pCVar15->req).size;
    lVar17 = (pCVar15->req).bytecount;
LAB_00139c2a:
    (conn->proto).ftpc.pp.response_time = 0;
    cVar6 = (pCVar15->req).offset;
    pvVar7 = (pCVar15->req).protop;
    CVar12 = Curl_get_upload_buffer(pCVar15);
    if (CVar12 == CURLE_OK) {
      upload_size = lVar16 - lVar17;
      if (0x7ffe < (long)upload_size) {
        upload_size = 0x7fff;
      }
      h = (smb_header *)(conn->data->state).ulbuf;
      *(undefined8 *)&h->uid = 0;
      *(undefined8 *)h[1].magic = 0;
      *(undefined8 *)((long)&h[1].status + 3) = 0;
      *(undefined8 *)(h[1].signature + 2) = 0;
      h->pid_high = 0;
      h->signature[0] = '\0';
      h->signature[1] = '\0';
      h->signature[2] = '\0';
      h->signature[3] = '\0';
      h->signature[4] = '\0';
      h->signature[5] = '\0';
      *(undefined8 *)(h->signature + 6) = 0;
      h[1].tid = 0;
      h[1].pid = 0;
      h->nbt_type = '\0';
      h->nbt_flags = '\0';
      h->nbt_length = 0;
      h->magic[0] = '\0';
      h->magic[1] = '\0';
      h->magic[2] = '\0';
      h->magic[3] = '\0';
      h->command = '\0';
      h->status = 0;
      h->flags = '\0';
      h->flags2 = 0;
      h[1].nbt_type = '\x0e';
      h[1].nbt_flags = 0xff;
      *(undefined2 *)(h[1].magic + 1) = *(undefined2 *)((long)pvVar7 + 0x12);
      *(int *)(h[1].magic + 3) = (int)cVar6;
      *(int *)(h[1].signature + 7) = (int)((ulong)cVar6 >> 0x20);
      *(short *)(h[1].signature + 3) = (short)upload_size;
      h[1].signature[5] = '@';
      h[1].signature[6] = '\0';
      *(short *)((long)&h[1].tid + 1) = (short)upload_size + 1;
      smb_format_message(conn,h,'/',upload_size + 0x20);
      CVar12 = smb_send(conn,0x44,upload_size);
      uVar8 = 4;
      break;
    }
    goto LAB_00139e9a;
  case 3:
    CVar12 = CURLE_RECV_ERROR;
    if ((*(int *)((long)msg + 9) == 0) && (0x31 < (ulong)(conn->proto).ftpc.pp.response_time)) {
      uVar9 = Curl_read16_le((uchar *)((long)msg + 0x2f));
      uVar10 = Curl_read16_le((uchar *)((long)pvVar7 + 0x31));
      if (uVar9 == 0) {
        len = 0;
LAB_00139dcb:
        pCVar15 = conn->data;
        lVar16 = (pCVar15->req).bytecount + len;
        (pCVar15->req).bytecount = lVar16;
        pcVar1 = &(pCVar15->req).offset;
        *pcVar1 = *pcVar1 + len;
        Curl_pgrsSetDownloadCounter(pCVar15,lVar16);
        if ((short)uVar9 < 0) {
          pCVar15 = conn->data;
          goto LAB_00139df5;
        }
        goto LAB_00139e56;
      }
      len = (ulong)uVar9;
      if ((ulong)(conn->proto).ftpc.pp.response_time < uVar10 + len + 4) {
        Curl_failf(conn->data,"Invalid input packet");
      }
      else {
        CVar12 = Curl_client_write(conn,1,(char *)((long)pvVar7 + (ulong)uVar10 + 4),len);
        if (CVar12 == CURLE_OK) goto LAB_00139dcb;
      }
    }
LAB_00139e52:
    piVar4[5] = CVar12;
    goto LAB_00139e56;
  case 4:
    CVar12 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)msg + 9) != 0) || ((ulong)(conn->proto).ftpc.pp.response_time < 0x2a))
    goto LAB_00139e52;
    uVar9 = Curl_read16_le((uchar *)((long)msg + 0x29));
    pCVar15 = conn->data;
    lVar16 = (pCVar15->req).bytecount + (ulong)uVar9;
    (pCVar15->req).bytecount = lVar16;
    pcVar1 = &(pCVar15->req).offset;
    *pcVar1 = *pcVar1 + (ulong)uVar9;
    Curl_pgrsSetUploadCounter(pCVar15,lVar16);
    pCVar15 = conn->data;
    lVar16 = (pCVar15->req).size;
    lVar17 = (pCVar15->req).bytecount;
    if (lVar17 < lVar16) goto LAB_00139c2a;
LAB_00139e56:
    (conn->proto).ftpc.pp.response_time = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar3 = *(undefined2 *)((long)(conn->data->req).protop + 0x12);
    uStack_463 = (undefined1)uVar3;
    local_462 = (undefined1)((ushort)uVar3 >> 8);
    CVar12 = smb_send_message(conn,'\x04',&local_464,9);
    uVar8 = 5;
    break;
  case 5:
switchD_00139920_caseD_5:
    (conn->proto).ftpc.pp.response_time = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar12 = smb_send_message(conn,'q',&local_464,3);
    uVar8 = 6;
    break;
  case 6:
    CVar12 = piVar4[5];
LAB_00139b7d:
    (conn->proto).ftpc.pp.response_time = 0;
    *done = true;
    uVar8 = 7;
    break;
  default:
    (conn->proto).ftpc.pp.response_time = 0;
    return CURLE_OK;
  }
  if (CVar12 == CURLE_OK) {
    *(undefined4 *)(conn->data->req).protop = uVar8;
  }
  else {
LAB_00139e9a:
    CVar11 = CVar12;
    Curl_conncontrol(conn,1);
  }
  return CVar11;
}

Assistant:

static CURLcode smb_request_state(struct connectdata *conn, bool *done)
{
  struct smb_request *req = conn->data->req.protop;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(conn);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(conn, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(conn, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    conn->data->req.offset = 0;
    if(conn->data->set.upload) {
      conn->data->req.size = conn->data->state.infilesize;
      Curl_pgrsSetUploadSize(conn->data, conn->data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      smb_m = (const struct smb_nt_create_response*) msg;
      conn->data->req.size = smb_swap64(smb_m->end_of_file);
      if(conn->data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(conn->data, conn->data->req.size);
        if(conn->data->set.get_filetime)
          get_posix_time(&conn->data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(conn->data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(conn, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetDownloadCounter(conn->data, conn->data->req.bytecount);
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    conn->data->req.bytecount += len;
    conn->data->req.offset += len;
    Curl_pgrsSetUploadCounter(conn->data, conn->data->req.bytecount);
    if(conn->data->req.bytecount >= conn->data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(conn);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(conn);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(conn);
    break;

  case SMB_CLOSE:
    result = smb_send_close(conn);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(conn);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(conn, next_state);

  return CURLE_OK;
}